

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O1

void aura_transport_register(aura_transport *tr)

{
  list_head *plVar1;
  char *pcVar2;
  char *pcVar3;
  
  plVar1 = transports.prev;
  pcVar2 = tr->name;
  if (pcVar2 == (char *)0x0) {
    pcVar3 = "name";
    pcVar2 = (char *)0x0;
  }
  else if (tr->open == (_func_int_aura_node_ptr_char_ptr *)0x0) {
    pcVar3 = "open";
  }
  else if (tr->close == (_func_void_aura_node_ptr *)0x0) {
    pcVar3 = "close";
  }
  else if (tr->handle_event == (_func_void_aura_node_ptr_node_event_aura_pollfds_ptr *)0x0) {
    pcVar3 = "handle_event";
  }
  else if (tr->buffer_get == (_func_aura_buffer_ptr_aura_buffer_ptr *)0x0) {
    if (tr->buffer_put == (_func_void_aura_buffer_ptr_aura_buffer_ptr *)0x0) goto LAB_00105606;
    pcVar3 = "buffer_get";
  }
  else {
    if (tr->buffer_put != (_func_void_aura_buffer_ptr_aura_buffer_ptr *)0x0) {
LAB_00105606:
      if (tr->buffer_overhead < tr->buffer_offset) {
        slog(0,3,"Transport has buffer_overhead (%d) < buffer_offset (%d). It will crash. Disabled")
        ;
        return;
      }
      transports.prev = &tr->registry;
      (tr->registry).next = &transports;
      (tr->registry).prev = plVar1;
      plVar1->next = &tr->registry;
      return;
    }
    pcVar3 = "buffer_put";
  }
  slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",pcVar2,pcVar3);
  return;
}

Assistant:

void aura_transport_register(struct aura_transport *tr)
{
	/* Check if we have all that is required */
	required(name);
	required(open);
	required(close);
	required(handle_event);

	if ((tr->buffer_get) || (tr->buffer_put)) {
		required(buffer_get);
		required(buffer_put)
	}

	/* Warn against erroneous config */
	if (tr->buffer_overhead < tr->buffer_offset) {
		slog(0, SLOG_WARN,
		     "Transport has buffer_overhead (%d) < buffer_offset (%d). It will crash. Disabled",
		     tr->buffer_overhead, tr->buffer_offset);
		return;
	}

	/* Add it! */
	list_add_tail(&tr->registry, &transports);
}